

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O3

void __thiscall
llbuild::buildsystem::ShellCommand::processMakefileDiscoveredDependencies(llbuild::buildsystem::
BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::StringRef,llvm::
MemoryBuffer*,bool)::DepsActions::error(llvm::StringRef_unsigned_long_
          (void *this,StringRef message,uint64_t position)

{
  undefined8 uVar1;
  raw_ostream *prVar2;
  BuildSystemDelegate *pBVar3;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  string msg;
  raw_string_ostream msgStream;
  string local_80;
  raw_string_ostream local_60;
  
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_60.super_raw_ostream.BufferMode = InternalBuffer;
  local_60.super_raw_ostream.OutBufStart = (char *)0x0;
  local_60.super_raw_ostream.OutBufEnd = (char *)0x0;
  local_60.super_raw_ostream.OutBufCur = (char *)0x0;
  local_60.super_raw_ostream._vptr_raw_ostream = (_func_int **)&PTR__raw_string_ostream_00251a98;
  local_60.OS = &local_80;
  Str.Length = 0x1f;
  Str.Data = "error reading dependency file \'";
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  prVar2 = llvm::raw_ostream::operator<<(&local_60.super_raw_ostream,Str);
  prVar2 = llvm::raw_ostream::operator<<(prVar2,*(StringRef *)((long)this + 0x28));
  Str_00.Length = 3;
  Str_00.Data = "\': ";
  prVar2 = llvm::raw_ostream::operator<<(prVar2,Str_00);
  prVar2 = llvm::raw_ostream::operator<<(prVar2,message);
  Str_01.Length = 0xd;
  Str_01.Data = " at position ";
  prVar2 = llvm::raw_ostream::operator<<(prVar2,Str_01);
  llvm::raw_ostream::operator<<(prVar2,position);
  pBVar3 = BuildSystem::getDelegate(*(BuildSystem **)((long)this + 8));
  uVar1 = *(undefined8 *)((long)this + 0x20);
  if (local_60.super_raw_ostream.OutBufCur != local_60.super_raw_ostream.OutBufStart) {
    llvm::raw_ostream::flush_nonempty(&local_60.super_raw_ostream);
  }
  (*pBVar3->_vptr_BuildSystemDelegate[0xb])
            (pBVar3,uVar1,((local_60.OS)->_M_dataplus)._M_p,(local_60.OS)->_M_string_length);
  *(int *)((long)this + 0x38) = *(int *)((long)this + 0x38) + 1;
  llvm::raw_string_ostream::~raw_string_ostream(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

virtual void error(StringRef message, uint64_t position) override {
      std::string msg;
      raw_string_ostream msgStream(msg);
      msgStream << "error reading dependency file '" << depsPath << "': "
          << message << " at position " << position;
      system.getDelegate().commandHadError(command, msgStream.str());
      ++numErrors;
    }